

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  bool bVar2;
  ImGuiContextHook *pIVar3;
  _func_void_int_int *p_Var4;
  char *__s1;
  ImGuiWindow **ppIVar5;
  unsigned_short *puVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  float fVar10;
  ImGuiID key;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar11;
  ImGuiWindow **ppIVar12;
  ulong uVar13;
  unsigned_short *__dest;
  byte bVar14;
  uint uVar15;
  char *pcVar16;
  char *label;
  ImGuiContext *g;
  ImGuiContext *g_2;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  ImRect local_48;
  
  pIVar9 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1096,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if (GImGui->WithinFrameScope == false) {
      __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x109b,"void ImGui::EndFrame()");
    }
    if (0 < (GImGui->Hooks).Size) {
      lVar18 = 0;
      lVar20 = 0;
      do {
        pIVar3 = (pIVar9->Hooks).Data;
        if (*(int *)(pIVar3 + lVar18) == 2) {
          (**(code **)(pIVar3 + lVar18 + 8))(pIVar9,pIVar3 + lVar18);
        }
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x18;
      } while (lVar20 < (pIVar9->Hooks).Size);
    }
    bVar2 = (GImGui->IO).KeyCtrl;
    uVar15 = bVar2 + 2;
    if ((GImGui->IO).KeyShift == false) {
      uVar15 = (uint)bVar2;
    }
    uVar22 = uVar15 + 4;
    if ((GImGui->IO).KeyAlt == false) {
      uVar22 = uVar15;
    }
    uVar15 = uVar22 + 8;
    if ((GImGui->IO).KeySuper == false) {
      uVar15 = uVar22;
    }
    if ((uVar15 != 0) && ((GImGui->IO).KeyMods != uVar15)) {
      __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1b53,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    iVar17 = (GImGui->CurrentWindowStack).Size;
    if (iVar17 != 1) {
      if (iVar17 < 2) {
        __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x1b65,"void ImGui::ErrorCheckEndFrameSanityChecks()");
      }
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1b5f,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    if ((GImGui->GroupStack).Size != 0) {
      __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1b69,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    p_Var4 = (pIVar9->IO).ImeSetInputScreenPosFn;
    if (p_Var4 != (_func_void_int_int *)0x0) {
      fVar23 = (pIVar9->PlatformImeLastPos).x;
      if (((fVar23 == 3.4028235e+38) && (!NAN(fVar23))) ||
         (fVar23 = fVar23 - (pIVar9->PlatformImePos).x,
         fVar24 = (pIVar9->PlatformImeLastPos).y - (pIVar9->PlatformImePos).y,
         0.0001 < fVar23 * fVar23 + fVar24 * fVar24)) {
        (*p_Var4)((int)(pIVar9->PlatformImePos).x,(int)(pIVar9->PlatformImePos).y);
        pIVar9->PlatformImeLastPos = pIVar9->PlatformImePos;
      }
    }
    pIVar9->WithinFrameScopeWithImplicitWindow = false;
    pIVar11 = pIVar9->CurrentWindow;
    if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WriteAccessed == false)) {
      pIVar11->Active = false;
    }
    End();
    pIVar8 = GImGui;
    if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar11 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar8->WindowsById,key);
        pIVar8->NavWindowingListWindow = pIVar11;
      }
      fVar23 = (pIVar8->IO).DisplaySize.x;
      fVar24 = (pIVar8->IO).DisplaySize.y;
      (pIVar8->NextWindowData).SizeConstraintRect.Min.x = fVar23 * 0.2;
      (pIVar8->NextWindowData).SizeConstraintRect.Min.y = fVar24 * 0.2;
      (pIVar8->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar8->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar8->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar8->NextWindowData).SizeCallbackUserData = (void *)0x0;
      *(byte *)&(pIVar8->NextWindowData).Flags = (byte)(pIVar8->NextWindowData).Flags | 0x11;
      IVar7.y = fVar24 * 0.5;
      IVar7.x = fVar23 * 0.5;
      (pIVar8->NextWindowData).PosVal = IVar7;
      (pIVar8->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar8->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar8->NextWindowData).PosCond = 1;
      fVar23 = (pIVar8->Style).WindowPadding.x;
      fVar24 = (pIVar8->Style).WindowPadding.y;
      local_48.Min.y = fVar24 + fVar24;
      local_48.Min.x = fVar23 + fVar23;
      PushStyleVar(1,&local_48.Min);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar18 = (long)(pIVar8->WindowsFocusOrder).Size;
      if (0 < lVar18) {
        do {
          if ((pIVar8->WindowsFocusOrder).Size < lVar18) goto LAB_00124e3a;
          pIVar11 = (pIVar8->WindowsFocusOrder).Data[lVar18 + -1];
          if (((pIVar11->WasActive == true) && (pIVar11->RootWindow == pIVar11)) &&
             (uVar15 = pIVar11->Flags, (uVar15 >> 0x13 & 1) == 0)) {
            __s1 = pIVar11->Name;
            pcVar16 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar16 == '#') {
                  if (pcVar16[1] == '#') goto LAB_0012475f;
                }
                else if (*pcVar16 == '\0') goto LAB_0012475f;
                pcVar16 = pcVar16 + 1;
              } while (pcVar16 != (char *)0xffffffffffffffff);
              pcVar16 = (char *)0xffffffffffffffff;
            }
LAB_0012475f:
            label = __s1;
            if ((__s1 == pcVar16) && (label = "(Popup)", (uVar15 >> 0x1a & 1) == 0)) {
              if ((uVar15 >> 10 & 1) != 0) {
                iVar17 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar17 == 0) goto LAB_0012479a;
              }
              label = "(Untitled)";
            }
LAB_0012479a:
            local_48.Min.x = 0.0;
            local_48.Min.y = 0.0;
            Selectable(label,pIVar8->NavWindowingTarget == pIVar11,0,&local_48.Min);
          }
          bVar2 = 1 < lVar18;
          lVar18 = lVar18 + -1;
        } while (bVar2);
      }
      End();
      PopStyleVar(1);
    }
    pIVar11 = pIVar8->NavWrapRequestWindow;
    if (((pIVar11 != (ImGuiWindow *)0x0) && (pIVar8->NavWindow == pIVar11)) &&
       ((GImGui->NavMoveRequest == true &&
        (((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
          (pIVar8->NavMoveRequestForward == ImGuiNavForward_None)) &&
         (pIVar8->NavLayer == ImGuiNavLayer_Main)))))) {
      uVar15 = pIVar8->NavWrapRequestFlags;
      if (uVar15 == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x2413,"void ImGui::NavEndFrame()");
      }
      local_48.Min = pIVar11->NavRectRel[0].Min;
      local_48.Max = pIVar11->NavRectRel[0].Max;
      iVar17 = pIVar8->NavMoveDir;
      if (iVar17 == 0) {
        if ((uVar15 & 5) == 0) {
          iVar17 = 0;
        }
        else {
          fVar23 = (pIVar11->SizeFull).x;
          fVar24 = (pIVar11->WindowPadding).x;
          fVar24 = fVar24 + fVar24 + (pIVar11->ContentSize).x;
          uVar22 = -(uint)(fVar24 <= fVar23);
          fVar23 = (float)(uVar22 & (uint)fVar23 | ~uVar22 & (uint)fVar24) - (pIVar11->Scroll).x;
          iVar17 = 0;
          if ((uVar15 & 4) != 0) {
            fVar24 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar24;
            local_48.Max.y = local_48.Max.y - fVar24;
            iVar17 = 2;
          }
          local_48.Max.x = fVar23;
          local_48.Min.x = fVar23;
          NavMoveRequestForward(0,iVar17,&local_48,uVar15);
        }
      }
      if ((uVar15 & 5) != 0 && pIVar8->NavMoveDir == 1) {
        fVar23 = (pIVar11->Scroll).x;
        fVar10 = local_48.Max.y;
        local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar23) ^ 0x80000000);
        fVar24 = local_48.Min.y;
        local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar23) ^ 0x80000000);
        if ((uVar15 & 4) != 0) {
          fVar23 = fVar10 - fVar24;
          local_48.Min.y = fVar24 + fVar23;
          local_48.Max.y = fVar23 + fVar10;
          iVar17 = 3;
        }
        NavMoveRequestForward(pIVar8->NavMoveDir,iVar17,&local_48,uVar15);
      }
      if ((uVar15 & 10) != 0 && pIVar8->NavMoveDir == 2) {
        fVar23 = (pIVar11->SizeFull).y;
        fVar24 = (pIVar11->WindowPadding).y;
        fVar24 = fVar24 + fVar24 + (pIVar11->ContentSize).y;
        uVar22 = -(uint)(fVar24 <= fVar23);
        fVar23 = (float)(uVar22 & (uint)fVar23 | ~uVar22 & (uint)fVar24) - (pIVar11->Scroll).y;
        if ((uVar15 & 8) != 0) {
          fVar24 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar24;
          local_48.Max.x = local_48.Max.x - fVar24;
          iVar17 = 0;
        }
        local_48.Max.y = fVar23;
        local_48.Min.y = fVar23;
        NavMoveRequestForward(pIVar8->NavMoveDir,iVar17,&local_48,uVar15);
      }
      if (pIVar8->NavMoveDir == 3 && (uVar15 & 10) != 0) {
        fVar23 = (pIVar11->Scroll).y;
        fVar10 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar23,local_48.Max.x) ^ 0x8000000000000000);
        fVar24 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar23,local_48.Min.x) ^ 0x8000000000000000);
        if ((uVar15 & 8) != 0) {
          fVar23 = fVar10 - fVar24;
          local_48.Min.x = fVar24 + fVar23;
          local_48.Max.x = fVar23 + fVar10;
          iVar17 = 1;
        }
        NavMoveRequestForward(pIVar8->NavMoveDir,iVar17,&local_48,uVar15);
      }
    }
    if (pIVar9->DragDropActive == true) {
      if ((pIVar9->DragDropPayload).DataFrameCount + 1 < pIVar9->FrameCount) {
        bVar14 = 1;
        if ((pIVar9->DragDropSourceFlags & 0x20) == 0) {
          if (4 < (ulong)(uint)pIVar9->DragDropMouseButton) {
            __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x11be,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
          }
          bVar14 = (GImGui->IO).MouseDown[(uint)pIVar9->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar14 = 0;
      }
      if ((bVar14 != 0) || ((pIVar9->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if (((pIVar9->DragDropActive == true) && (pIVar9->DragDropSourceFrameCount < pIVar9->FrameCount)
        ) && ((pIVar9->DragDropSourceFlags & 1) == 0)) {
      pIVar9->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar9->DragDropWithinSource = false;
    }
    pIVar9->WithinFrameScope = false;
    pIVar9->FrameCountEnded = pIVar9->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar17 = (pIVar9->WindowsTempSortBuffer).Capacity;
    if (iVar17 < 0) {
      uVar15 = iVar17 / 2 + iVar17;
      uVar13 = 0;
      if (0 < (int)uVar15) {
        uVar13 = (ulong)uVar15;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar13 * 8,GImAllocatorUserData);
      ppIVar5 = (pIVar9->WindowsTempSortBuffer).Data;
      if (ppIVar5 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar12,ppIVar5,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
        ppIVar5 = (pIVar9->WindowsTempSortBuffer).Data;
        if ((ppIVar5 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (pIVar9->WindowsTempSortBuffer).Data = ppIVar12;
      (pIVar9->WindowsTempSortBuffer).Capacity = (int)uVar13;
    }
    (pIVar9->WindowsTempSortBuffer).Size = 0;
    iVar17 = (pIVar9->Windows).Size;
    if ((pIVar9->WindowsTempSortBuffer).Capacity < iVar17) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar17 << 3,GImAllocatorUserData);
      ppIVar5 = (pIVar9->WindowsTempSortBuffer).Data;
      if (ppIVar5 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar12,ppIVar5,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
        ppIVar5 = (pIVar9->WindowsTempSortBuffer).Data;
        if ((ppIVar5 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (pIVar9->WindowsTempSortBuffer).Data = ppIVar12;
      (pIVar9->WindowsTempSortBuffer).Capacity = iVar17;
    }
    uVar15 = (pIVar9->Windows).Size;
    uVar13 = (ulong)uVar15;
    if (uVar15 != 0) {
      uVar21 = 0;
      do {
        if ((long)(int)uVar13 <= (long)uVar21) {
LAB_00124e3a:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                        ,0x65c,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        pIVar11 = (pIVar9->Windows).Data[uVar21];
        if ((pIVar11->Active != true) || ((pIVar11->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar9->WindowsTempSortBuffer,pIVar11);
        }
        uVar21 = uVar21 + 1;
        uVar15 = (pIVar9->Windows).Size;
        uVar13 = (ulong)uVar15;
      } while (uVar21 != uVar13);
    }
    uVar22 = (pIVar9->WindowsTempSortBuffer).Size;
    if (uVar15 != uVar22) {
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x10d6,"void ImGui::EndFrame()");
    }
    (pIVar9->WindowsTempSortBuffer).Size = uVar15;
    (pIVar9->Windows).Size = uVar22;
    iVar17 = (pIVar9->WindowsTempSortBuffer).Capacity;
    (pIVar9->WindowsTempSortBuffer).Capacity = (pIVar9->Windows).Capacity;
    (pIVar9->Windows).Capacity = iVar17;
    ppIVar5 = (pIVar9->WindowsTempSortBuffer).Data;
    (pIVar9->WindowsTempSortBuffer).Data = (pIVar9->Windows).Data;
    (pIVar9->Windows).Data = ppIVar5;
    (pIVar9->IO).MetricsActiveWindows = pIVar9->WindowsActiveCount;
    ((pIVar9->IO).Fonts)->Locked = false;
    (pIVar9->IO).MouseWheel = 0.0;
    (pIVar9->IO).MouseWheelH = 0.0;
    iVar17 = (pIVar9->IO).InputQueueCharacters.Capacity;
    if (iVar17 < 0) {
      iVar17 = iVar17 / 2 + iVar17;
      iVar19 = 0;
      if (0 < iVar17) {
        iVar19 = iVar17;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar19 * 2),GImAllocatorUserData);
      puVar6 = (pIVar9->IO).InputQueueCharacters.Data;
      if (puVar6 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar6,(long)(pIVar9->IO).InputQueueCharacters.Size * 2);
        puVar6 = (pIVar9->IO).InputQueueCharacters.Data;
        if ((puVar6 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
      }
      (pIVar9->IO).InputQueueCharacters.Data = __dest;
      (pIVar9->IO).InputQueueCharacters.Capacity = iVar19;
    }
    (pIVar9->IO).InputQueueCharacters.Size = 0;
    (pIVar9->IO).NavInputs[0] = 0.0;
    (pIVar9->IO).NavInputs[1] = 0.0;
    (pIVar9->IO).NavInputs[2] = 0.0;
    (pIVar9->IO).NavInputs[3] = 0.0;
    (pIVar9->IO).NavInputs[4] = 0.0;
    (pIVar9->IO).NavInputs[5] = 0.0;
    (pIVar9->IO).NavInputs[6] = 0.0;
    (pIVar9->IO).NavInputs[7] = 0.0;
    (pIVar9->IO).NavInputs[8] = 0.0;
    (pIVar9->IO).NavInputs[9] = 0.0;
    (pIVar9->IO).NavInputs[10] = 0.0;
    (pIVar9->IO).NavInputs[0xb] = 0.0;
    (pIVar9->IO).NavInputs[0xc] = 0.0;
    (pIVar9->IO).NavInputs[0xd] = 0.0;
    (pIVar9->IO).NavInputs[0xe] = 0.0;
    (pIVar9->IO).NavInputs[0xf] = 0.0;
    (pIVar9->IO).NavInputs[0x10] = 0.0;
    (pIVar9->IO).NavInputs[0x11] = 0.0;
    (pIVar9->IO).NavInputs[0x12] = 0.0;
    (pIVar9->IO).NavInputs[0x13] = 0.0;
    (pIVar9->IO).NavInputs[0x14] = 0.0;
    if (0 < (pIVar9->Hooks).Size) {
      lVar18 = 0;
      lVar20 = 0;
      do {
        pIVar3 = (pIVar9->Hooks).Data;
        if (*(int *)(pIVar3 + lVar18) == 3) {
          (**(code **)(pIVar3 + lVar18 + 8))(pIVar9,pIVar3 + lVar18);
        }
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x18;
      } while (lVar20 < (pIVar9->Hooks).Size);
    }
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}